

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# source_hole.c
# Opt level: O0

hole_t * hole_new(char *fname,int flags,zip_error_t *error)

{
  char *pcVar1;
  buffer_t *pbVar2;
  hole_t *ctx;
  zip_error_t *error_local;
  int flags_local;
  char *fname_local;
  
  fname_local = (char *)malloc(0x28);
  if (fname_local == (char *)0x0) {
    zip_error_set(error,0xe,0);
    fname_local = (char *)0x0;
  }
  else {
    pcVar1 = strdup(fname);
    *(char **)(fname_local + 0x10) = pcVar1;
    if (pcVar1 == (char *)0x0) {
      free(fname_local);
      zip_error_set(error,0xe,0);
      fname_local = (char *)0x0;
    }
    else {
      pbVar2 = buffer_from_file(fname,flags,error);
      *(buffer_t **)(fname_local + 0x18) = pbVar2;
      if (pbVar2 == (buffer_t *)0x0) {
        free(fname_local);
        fname_local = (char *)0x0;
      }
      else {
        zip_error_init(fname_local);
        fname_local[0x20] = '\0';
        fname_local[0x21] = '\0';
        fname_local[0x22] = '\0';
        fname_local[0x23] = '\0';
        fname_local[0x24] = '\0';
        fname_local[0x25] = '\0';
        fname_local[0x26] = '\0';
        fname_local[0x27] = '\0';
      }
    }
  }
  return (hole_t *)fname_local;
}

Assistant:

static hole_t *
hole_new(const char *fname, int flags, zip_error_t *error) {
    hole_t *ctx = (hole_t *)malloc(sizeof(*ctx));

    if (ctx == NULL) {
	zip_error_set(error, ZIP_ER_MEMORY, 0);
	return NULL;
    }

    if ((ctx->fname = strdup(fname)) == NULL) {
	free(ctx);
	zip_error_set(error, ZIP_ER_MEMORY, 0);
	return NULL;
    }

    if ((ctx->in = buffer_from_file(fname, flags, error)) == NULL) {
	free(ctx);
	return NULL;
    }

    zip_error_init(&ctx->error);
    ctx->out = NULL;

    return ctx;
}